

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O2

void __thiscall mocker::detail::InterferenceGraph::classifyNode(InterferenceGraph *this,Node *n)

{
  bool bVar1;
  iterator iVar2;
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var3;
  anon_class_8_1_54a3980e removeIfExists;
  anon_class_8_1_54a3980e local_38;
  
  bVar1 = isPrecolored(n);
  if (bVar1) {
    __assert_fail("!isPrecolored(n)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp"
                  ,0xf2,"void mocker::detail::InterferenceGraph::classifyNode(const Node &)");
  }
  iVar2 = std::
          _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->coalesced)._M_h,n);
  if (iVar2.super__Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true>._M_cur !=
      (__node_type *)0x0) {
    __assert_fail("coalesced.find(n) == coalesced.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp"
                  ,0xf3,"void mocker::detail::InterferenceGraph::classifyNode(const Node &)");
  }
  iVar2 = std::
          _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->removed)._M_h,n);
  if (iVar2.super__Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true>._M_cur !=
      (__node_type *)0x0) {
    __assert_fail("removed.find(n) == removed.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp"
                  ,0xf4,"void mocker::detail::InterferenceGraph::classifyNode(const Node &)");
  }
  local_38.n = n;
  classifyNode::anon_class_8_1_54a3980e::operator()(&local_38,&this->simplifiable);
  classifyNode::anon_class_8_1_54a3980e::operator()(&local_38,&this->highDegree);
  classifyNode::anon_class_8_1_54a3980e::operator()(&local_38,&this->freeze);
  bVar1 = isOfHighDegree(this,n);
  p_Var3 = (_Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            *)&this->highDegree;
  if ((!bVar1) &&
     (bVar1 = std::function<bool_(const_std::shared_ptr<mocker::nasm::Register>_&)>::operator()
                        (&this->isMoveRelated,n),
     p_Var3 = (_Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)&this->simplifiable, bVar1)) {
    p_Var3 = (_Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->freeze;
  }
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_M_emplace<std::shared_ptr<mocker::nasm::Register>const&>(p_Var3,n);
  return;
}

Assistant:

void InterferenceGraph::classifyNode(const Node &n) {
  assert(!isPrecolored(n));
  assert(coalesced.find(n) == coalesced.end());
  assert(removed.find(n) == removed.end());

  auto removeIfExists = [&n](RegSet &s) {
    auto iter = s.find(n);
    if (iter != s.end())
      s.erase(iter);
  };

  removeIfExists(simplifiable);
  removeIfExists(highDegree);
  removeIfExists(freeze);
  if (isOfHighDegree(n)) {
    highDegree.emplace(n);
    return;
  }
  if (isMoveRelated(n)) {
    freeze.emplace(n);
    return;
  }
  simplifiable.emplace(n);
}